

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

message_t * message_get(uint16_t age)

{
  message_t *local_18;
  message_t *m;
  uint16_t age_local;
  
  m._6_2_ = age;
  for (local_18 = messages->head; local_18 != (message_t *)0x0 && m._6_2_ != 0;
      local_18 = local_18->older) {
    m._6_2_ = m._6_2_ - 1;
  }
  return local_18;
}

Assistant:

static message_t *message_get(uint16_t age)
{
	message_t *m = messages->head;

	while (m && age) {
		age--;
		m = m->older;
	}

	return m;
}